

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_aes_decrypt.c
# Opt level: O3

int tc_aes_decrypt(uint8_t *out,uint8_t *in,TCAesKeySched_t s)

{
  EVP_PKEY_CTX *dst;
  uint uVar1;
  uint i;
  int iVar2;
  long lVar3;
  long lVar4;
  uint8_t local_58;
  uint8_t local_57;
  uint8_t local_56;
  uint8_t local_55;
  uint8_t local_54;
  uint8_t local_53;
  uint8_t local_52;
  uint8_t local_51;
  uint8_t t [16];
  uint8_t state [16];
  
  iVar2 = 0;
  if (s != (TCAesKeySched_t)0x0 && (in != (uint8_t *)0x0 && out != (uint8_t *)0x0)) {
    dst = (EVP_PKEY_CTX *)(t + 8);
    _copy(dst,(EVP_PKEY_CTX *)0x10);
    uVar1 = s->words[0x28];
    t[8] = t[8] ^ (byte)(uVar1 >> 0x18);
    t[9] = t[9] ^ (byte)(uVar1 >> 0x10);
    t[10] = t[10] ^ (byte)(uVar1 >> 8);
    t[0xb] = t[0xb] ^ (byte)uVar1;
    uVar1 = s->words[0x29];
    t[0xc] = t[0xc] ^ (byte)(uVar1 >> 0x18);
    t[0xd] = t[0xd] ^ (byte)(uVar1 >> 0x10);
    t[0xe] = t[0xe] ^ (byte)(uVar1 >> 8);
    t[0xf] = t[0xf] ^ (byte)uVar1;
    uVar1 = s->words[0x2a];
    state[0] = state[0] ^ (byte)(uVar1 >> 0x18);
    state[1] = state[1] ^ (byte)(uVar1 >> 0x10);
    state[2] = state[2] ^ (byte)(uVar1 >> 8);
    state[3] = state[3] ^ (byte)uVar1;
    uVar1 = s->words[0x2b];
    state[4] = state[4] ^ (byte)(uVar1 >> 0x18);
    state[5] = state[5] ^ (byte)(uVar1 >> 0x10);
    state[6] = state[6] ^ (byte)(uVar1 >> 8);
    state[7] = state[7] ^ (byte)uVar1;
    lVar4 = 9;
    do {
      local_58 = t[8];
      local_57 = state[5];
      local_56 = state[2];
      local_55 = t[0xf];
      local_54 = t[0xc];
      local_53 = t[9];
      local_52 = state[6];
      local_51 = state[3];
      t[0] = state[0];
      t[1] = t[0xd];
      t[2] = t[10];
      t[3] = state[7];
      t[4] = state[4];
      t[5] = state[1];
      t[6] = t[0xe];
      t[7] = t[0xb];
      _copy(dst,(EVP_PKEY_CTX *)0x10);
      lVar3 = 0;
      do {
        t[lVar3 + 8] = inv_sbox[t[lVar3 + 8]];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      uVar1 = s->words[lVar4 * 4];
      t[8] = t[8] ^ (byte)(uVar1 >> 0x18);
      t[9] = t[9] ^ (byte)(uVar1 >> 0x10);
      t[10] = t[10] ^ (byte)(uVar1 >> 8);
      t[0xb] = t[0xb] ^ (byte)uVar1;
      uVar1 = s->words[lVar4 * 4 + 1];
      t[0xc] = t[0xc] ^ (byte)(uVar1 >> 0x18);
      t[0xd] = t[0xd] ^ (byte)(uVar1 >> 0x10);
      t[0xe] = t[0xe] ^ (byte)(uVar1 >> 8);
      t[0xf] = t[0xf] ^ (byte)uVar1;
      uVar1 = s->words[lVar4 * 4 + 2];
      state[0] = state[0] ^ (byte)(uVar1 >> 0x18);
      state[1] = state[1] ^ (byte)(uVar1 >> 0x10);
      state[2] = state[2] ^ (byte)(uVar1 >> 8);
      state[3] = state[3] ^ (byte)uVar1;
      uVar1 = s->words[lVar4 * 4 + 3];
      state[4] = state[4] ^ (byte)(uVar1 >> 0x18);
      state[5] = state[5] ^ (byte)(uVar1 >> 0x10);
      state[6] = state[6] ^ (byte)(uVar1 >> 8);
      state[7] = state[7] ^ (byte)uVar1;
      mult_row_column(&local_58,(uint8_t *)dst);
      mult_row_column(&local_54,t + 0xc);
      mult_row_column(t,state);
      mult_row_column(t + 4,state + 4);
      _copy(dst,(EVP_PKEY_CTX *)0x10);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    local_58 = t[8];
    local_57 = state[5];
    local_56 = state[2];
    local_55 = t[0xf];
    local_54 = t[0xc];
    local_53 = t[9];
    local_52 = state[6];
    local_51 = state[3];
    t[0] = state[0];
    t[1] = t[0xd];
    t[2] = t[10];
    t[3] = state[7];
    t[4] = state[4];
    t[5] = state[1];
    t[6] = t[0xe];
    t[7] = t[0xb];
    _copy((EVP_PKEY_CTX *)(t + 8),(EVP_PKEY_CTX *)0x10);
    lVar4 = 0;
    do {
      t[lVar4 + 8] = inv_sbox[t[lVar4 + 8]];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    uVar1 = s->words[0];
    t[8] = t[8] ^ (byte)(uVar1 >> 0x18);
    t[9] = t[9] ^ (byte)(uVar1 >> 0x10);
    t[10] = t[10] ^ (byte)(uVar1 >> 8);
    t[0xb] = t[0xb] ^ (byte)uVar1;
    uVar1 = s->words[1];
    t[0xc] = t[0xc] ^ (byte)(uVar1 >> 0x18);
    t[0xd] = t[0xd] ^ (byte)(uVar1 >> 0x10);
    t[0xe] = t[0xe] ^ (byte)(uVar1 >> 8);
    t[0xf] = t[0xf] ^ (byte)uVar1;
    uVar1 = s->words[2];
    state[0] = state[0] ^ (byte)(uVar1 >> 0x18);
    state[1] = state[1] ^ (byte)(uVar1 >> 0x10);
    state[2] = state[2] ^ (byte)(uVar1 >> 8);
    state[3] = state[3] ^ (byte)uVar1;
    uVar1 = s->words[3];
    state[4] = state[4] ^ (byte)(uVar1 >> 0x18);
    state[5] = state[5] ^ (byte)(uVar1 >> 0x10);
    state[6] = state[6] ^ (byte)(uVar1 >> 8);
    state[7] = state[7] ^ (byte)uVar1;
    _copy((EVP_PKEY_CTX *)out,(EVP_PKEY_CTX *)0x10);
    _set(t + 8,'\0',0x10);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int tc_aes_decrypt(uint8_t *out, const uint8_t *in, const TCAesKeySched_t s)
{
	uint8_t state[Nk*Nb];
	unsigned int i;

	if (out == (uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	} else if (in == (const uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	} else if (s == (TCAesKeySched_t) 0) {
		return TC_CRYPTO_FAIL;
	}

	(void)_copy(state, sizeof(state), in, sizeof(state));

	add_round_key(state, s->words + Nb*Nr);

	for (i = Nr - 1; i > 0; --i) {
		inv_shift_rows(state);
		inv_sub_bytes(state);
		add_round_key(state, s->words + Nb*i);
		inv_mix_columns(state);
	}

	inv_shift_rows(state);
	inv_sub_bytes(state);
	add_round_key(state, s->words);

	(void)_copy(out, sizeof(state), state, sizeof(state));

	/*zeroing out the state buffer */
	_set(state, TC_ZERO_BYTE, sizeof(state));


	return TC_CRYPTO_SUCCESS;
}